

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

bool __thiscall cmTarget::IsXCTestOnApple(cmTarget *this)

{
  bool bVar1;
  bool local_4e;
  allocator local_39;
  string local_38;
  cmTarget *local_18;
  cmTarget *this_local;
  
  local_18 = this;
  bVar1 = IsCFBundleOnApple(this);
  local_4e = false;
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_38,"XCTEST",&local_39);
    local_4e = GetPropertyAsBool(this,&local_38);
  }
  this_local._7_1_ = local_4e;
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmTarget::IsXCTestOnApple() const
{
  return (this->IsCFBundleOnApple() &&
          this->GetPropertyAsBool("XCTEST"));
}